

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

bool __thiscall HEkk::getBacktrackingBasis(HEkk *this)

{
  bool bVar1;
  pointer pdVar2;
  pointer pdVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  bVar1 = (this->info_).valid_backtracking_basis_;
  if (bVar1 == true) {
    SimplexBasis::operator=(&this->basis_,&(this->info_).backtracking_basis_);
    (this->info_).costs_shifted = (this->info_).backtracking_basis_costs_shifted_ != 0;
    (this->info_).costs_perturbed = (this->info_).backtracking_basis_costs_perturbed_ != 0;
    std::vector<double,_std::allocator<double>_>::operator=
              (&(this->info_).workShift_,&(this->info_).backtracking_basis_workShift_);
    uVar4 = (this->lp_).num_row_ + (this->lp_).num_col_;
    pdVar2 = (this->info_).backtracking_basis_edge_weight_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar3 = (this->scattered_dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      pdVar3[uVar6] = pdVar2[uVar6];
    }
  }
  return bVar1;
}

Assistant:

bool HEkk::getBacktrackingBasis() {
  if (!info_.valid_backtracking_basis_) return false;
  basis_ = info_.backtracking_basis_;
  info_.costs_shifted = (info_.backtracking_basis_costs_shifted_ != 0);
  info_.costs_perturbed = (info_.backtracking_basis_costs_perturbed_ != 0);
  info_.workShift_ = info_.backtracking_basis_workShift_;
  const HighsInt num_tot = lp_.num_col_ + lp_.num_row_;
  for (HighsInt iVar = 0; iVar < num_tot; iVar++)
    scattered_dual_edge_weight_[iVar] =
        info_.backtracking_basis_edge_weight_[iVar];
  return true;
}